

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydatapointer.h
# Opt level: O3

void __thiscall
QArrayDataPointer<QList<QString>_>::reallocateAndGrow
          (QArrayDataPointer<QList<QString>_> *this,GrowthPosition where,qsizetype n,
          QArrayDataPointer<QList<QString>_> *old)

{
  QArrayData *pQVar1;
  Data *pDVar2;
  QString *pQVar3;
  qsizetype qVar4;
  Data *pDVar5;
  QList<QString> *pQVar6;
  long lVar7;
  QList<QString> *pQVar8;
  long in_FS_OFFSET;
  undefined1 auVar9 [16];
  QArrayDataPointer<QList<QString>_> local_38;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  if ((((old == (QArrayDataPointer<QList<QString>_> *)0x0 && where == GrowsAtEnd) &&
       (pQVar1 = &this->d->super_QArrayData, pQVar1 != (QArrayData *)0x0)) && (0 < n)) &&
     ((pQVar1->ref_)._q_value.super___atomic_base<int>._M_i < 2)) {
    auVar9 = QArrayData::reallocateUnaligned
                       (pQVar1,this->ptr,0x18,
                        n + this->size +
                        ((long)((long)this->ptr -
                               ((ulong)((long)&pQVar1[1].alloc + 7U) & 0xfffffffffffffff0)) >> 3) *
                        -0x5555555555555555,Grow);
    this->d = (Data *)auVar9._0_8_;
    this->ptr = (QList<QString> *)auVar9._8_8_;
  }
  else {
    local_38.size = -0x5555555555555556;
    local_38.d = (Data *)0xaaaaaaaaaaaaaaaa;
    local_38.ptr = (QList<QString> *)0xaaaaaaaaaaaaaaaa;
    allocateGrow(&local_38,this,n,where);
    if (this->size != 0) {
      lVar7 = this->size + (n >> 0x3f & n);
      if (((this->d == (Data *)0x0) || (old != (QArrayDataPointer<QList<QString>_> *)0x0)) ||
         (1 < (this->d->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i)) {
        if ((lVar7 != 0) && (0 < lVar7)) {
          pQVar8 = this->ptr;
          pQVar6 = pQVar8 + lVar7;
          do {
            pDVar2 = (pQVar8->d).d;
            local_38.ptr[local_38.size].d.d = pDVar2;
            local_38.ptr[local_38.size].d.ptr = (pQVar8->d).ptr;
            local_38.ptr[local_38.size].d.size = (pQVar8->d).size;
            if (pDVar2 != (Data *)0x0) {
              LOCK();
              (pDVar2->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
                   (pDVar2->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
              UNLOCK();
            }
            pQVar8 = pQVar8 + 1;
            local_38.size = local_38.size + 1;
          } while (pQVar8 < pQVar6);
        }
      }
      else if ((lVar7 != 0) && (0 < lVar7)) {
        pQVar8 = this->ptr;
        pQVar6 = pQVar8 + lVar7;
        do {
          pDVar2 = (pQVar8->d).d;
          (pQVar8->d).d = (Data *)0x0;
          local_38.ptr[local_38.size].d.d = pDVar2;
          pQVar3 = (pQVar8->d).ptr;
          (pQVar8->d).ptr = (QString *)0x0;
          local_38.ptr[local_38.size].d.ptr = pQVar3;
          qVar4 = (pQVar8->d).size;
          (pQVar8->d).size = 0;
          local_38.ptr[local_38.size].d.size = qVar4;
          pQVar8 = pQVar8 + 1;
          local_38.size = local_38.size + 1;
        } while (pQVar8 < pQVar6);
      }
    }
    pDVar5 = this->d;
    pQVar6 = this->ptr;
    this->d = local_38.d;
    this->ptr = local_38.ptr;
    qVar4 = this->size;
    this->size = local_38.size;
    local_38.d = pDVar5;
    local_38.ptr = pQVar6;
    local_38.size = qVar4;
    if (old != (QArrayDataPointer<QList<QString>_> *)0x0) {
      local_38.d = old->d;
      local_38.ptr = old->ptr;
      old->d = pDVar5;
      old->ptr = pQVar6;
      local_38.size = old->size;
      old->size = qVar4;
    }
    ~QArrayDataPointer(&local_38);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_20) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

Q_NEVER_INLINE void reallocateAndGrow(QArrayData::GrowthPosition where, qsizetype n,
                                          QArrayDataPointer *old = nullptr)
    {
        if constexpr (QTypeInfo<T>::isRelocatable && alignof(T) <= alignof(std::max_align_t)) {
            if (where == QArrayData::GrowsAtEnd && !old && !needsDetach() && n > 0) {
                (*this)->reallocate(constAllocatedCapacity() - freeSpaceAtEnd() + n, QArrayData::Grow); // fast path
                return;
            }
        }

        QArrayDataPointer dp(allocateGrow(*this, n, where));
        if (n > 0)
            Q_CHECK_PTR(dp.data());
        if (where == QArrayData::GrowsAtBeginning) {
            Q_ASSERT(dp.freeSpaceAtBegin() >= n);
        } else {
            Q_ASSERT(dp.freeSpaceAtEnd() >= n);
        }
        if (size) {
            qsizetype toCopy = size;
            if (n < 0)
                toCopy += n;
            if (needsDetach() || old)
                dp->copyAppend(begin(), begin() + toCopy);
            else
                dp->moveAppend(begin(), begin() + toCopy);
            Q_ASSERT(dp.size == toCopy);
        }

        swap(dp);
        if (old)
            old->swap(dp);
    }